

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::anon_unknown_135::initialize_piece_info
          (anon_unknown_135 *this,piece_picker *p,torrent_info *ti,int block_size,
          vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *blk,
          span<const_libtorrent::aux::piece_picker::downloading_piece> q,
          vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
          *queue)

{
  torrent_peer *this_00;
  block_info *pbVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  block_info *pbVar5;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  undefined1 auVar6 [16];
  ushort local_17c;
  ushort local_16c;
  peer_connection_interface *local_160;
  ushort local_14c;
  bool local_13d;
  uint local_13c;
  endpoint local_124;
  undefined8 local_108;
  piece_block_progress pbp;
  peer_connection *peer;
  torrent_peer *tp;
  bool local_c9;
  reference pvStack_c8;
  bool complete;
  block_info *bi;
  block_info *info;
  block_info *__end3;
  block_info *__begin3;
  span<const_libtorrent::aux::piece_picker::block_info> *local_98;
  span<const_libtorrent::aux::piece_picker::block_info> *__range3;
  int local_88;
  int idx;
  reference pvStack_80;
  int piece_size;
  block_info *blocks;
  undefined1 local_70 [8];
  partial_piece_info pi;
  downloading_piece *i;
  piece_index_t local_40;
  int counter;
  vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *pvStack_38;
  int blocks_per_piece;
  vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *blk_local;
  torrent_info *ptStack_28;
  int block_size_local;
  torrent_info *ti_local;
  piece_picker *p_local;
  span<const_libtorrent::aux::piece_picker::downloading_piece> q_local;
  
  pvStack_38 = (vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_> *)
               CONCAT44(in_register_0000000c,block_size);
  blk_local._4_4_ = (int)ti;
  ptStack_28 = (torrent_info *)p;
  ti_local = (torrent_info *)this;
  p_local = (piece_picker *)blk;
  q_local.m_ptr = (downloading_piece *)queue;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_40,0);
  counter = piece_picker::blocks_in_piece((piece_picker *)this,local_40);
  i._4_4_ = 0;
  for (pi.blocks = (block_info *)
                   span<const_libtorrent::aux::piece_picker::downloading_piece>::begin
                             ((span<const_libtorrent::aux::piece_picker::downloading_piece> *)
                              &p_local); pbVar1 = pi.blocks,
      pbVar5 = (block_info *)
               span<const_libtorrent::aux::piece_picker::downloading_piece>::end
                         ((span<const_libtorrent::aux::piece_picker::downloading_piece> *)&p_local),
      pbVar1 != pbVar5; pi.blocks = (block_info *)((long)&(pi.blocks)->addr + 0xc)) {
    blocks._4_4_ = *(int *)((pi.blocks)->addr).v4._M_elems;
    local_70._4_4_ = piece_picker::blocks_in_piece((piece_picker *)ti_local,blocks._4_4_);
    pi.piece_index.m_val = *(uint *)((long)&(pi.blocks)->addr + 6) & 0x7fff;
    pi.blocks_in_piece = *(uint *)((long)&(pi.blocks)->addr + 6) >> 0x10 & 0x7fff;
    pi.finished = (int)(*(ushort *)((long)&(pi.blocks)->addr + 10) & 0x7fff);
    pvStack_80 = ::std::vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>::
                 operator[](pvStack_38,(long)(i._4_4_ * counter));
    local_88 = *(int *)((pi.blocks)->addr).v4._M_elems;
    pi._16_8_ = pvStack_80;
    idx = torrent_info::piece_size(ptStack_28,(piece_index_t)local_88);
    __range3._4_4_ = -1;
    ___begin3 = piece_picker::blocks_for_piece
                          ((piece_picker *)ti_local,(downloading_piece *)pi.blocks);
    local_98 = (span<const_libtorrent::aux::piece_picker::block_info> *)&__begin3;
    __end3 = span<const_libtorrent::aux::piece_picker::block_info>::begin(local_98);
    info = span<const_libtorrent::aux::piece_picker::block_info>::end(local_98);
    for (; __end3 != info; __end3 = __end3 + 1) {
      bi = (block_info *)__end3;
      __range3._4_4_ = __range3._4_4_ + 1;
      pvStack_c8 = pvStack_80 + __range3._4_4_;
      *(uint *)&pvStack_c8->field_0x14 =
           *(uint *)&pvStack_c8->field_0x14 & 0xfffe7fff |
           (uint)(*(ushort *)&__end3->field_0x8 >> 0xe) << 0xf;
      if (__range3._4_4_ < local_70._4_4_ + -1) {
        local_13c = numeric_cast<unsigned_int,int,void>(blk_local._4_4_);
      }
      else {
        local_13c = numeric_cast<unsigned_int,int,void>(idx - __range3._4_4_ * blk_local._4_4_);
      }
      pbVar1 = pvStack_c8;
      *(uint *)&pvStack_c8->field_0x14 =
           *(uint *)&pvStack_c8->field_0x14 & 0xffff8000 | local_13c & 0x7fff;
      local_13d = true;
      if ((*(uint *)&pvStack_c8->field_0x14 >> 0xf & 3) != 2) {
        local_13d = (*(uint *)&pvStack_c8->field_0x14 >> 0xf & 3) == 3;
      }
      local_c9 = local_13d;
      if (*(long *)&bi->addr == 0) {
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
                  ((basic_endpoint<boost::asio::ip::tcp> *)&tp);
        block_info::set_peer(pbVar1,(endpoint *)&tp);
        if ((local_c9 & 1U) == 0) {
          local_14c = 0;
        }
        else {
          local_14c = (ushort)*(undefined4 *)&pvStack_c8->field_0x14 & 0x7fff;
        }
        *(ushort *)&pvStack_c8->field_0x12 = *(ushort *)&pvStack_c8->field_0x12 & 0x8000 | local_14c
        ;
      }
      else {
        this_00 = *(torrent_peer **)&bi->addr;
        if (this_00->connection == (peer_connection_interface *)0x0) {
          torrent_peer::ip(&local_124,this_00);
          block_info::set_peer(pbVar1,&local_124);
          if ((local_c9 & 1U) == 0) {
            local_17c = 0;
          }
          else {
            local_17c = (ushort)*(undefined4 *)&pvStack_c8->field_0x14 & 0x7fff;
          }
          *(ushort *)&pvStack_c8->field_0x12 =
               *(ushort *)&pvStack_c8->field_0x12 & 0x8000 | local_17c;
        }
        else {
          if (this_00->connection == (peer_connection_interface *)0x0) {
            local_160 = (peer_connection_interface *)0x0;
          }
          else {
            local_160 = this_00->connection + -0x10;
          }
          pbp._8_8_ = local_160;
          iVar3 = (*local_160->_vptr_peer_connection_interface[0x10])();
          block_info::set_peer(pbVar1,(endpoint *)CONCAT44(extraout_var,iVar3));
          if ((*(uint *)&pvStack_c8->field_0x14 >> 0xf & 3) == 1) {
            auVar6 = (**(code **)(*(long *)pbp._8_8_ + 0xe0))();
            pbp._0_8_ = auVar6._8_8_;
            local_108 = auVar6._0_8_;
            bVar2 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                              ((strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                               &local_108,
                               (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                               pi.blocks);
            if ((bVar2) && (local_108._4_4_ == __range3._4_4_)) {
              uVar4 = numeric_cast<unsigned_int,int,void>(pbp.piece_index.m_val);
              *(ushort *)&pvStack_c8->field_0x12 =
                   *(ushort *)&pvStack_c8->field_0x12 & 0x8000 | (ushort)uVar4 & 0x7fff;
            }
            else {
              *(ushort *)&pvStack_c8->field_0x12 = *(ushort *)&pvStack_c8->field_0x12 & 0x8000;
            }
          }
          else {
            if ((local_c9 & 1U) == 0) {
              local_16c = 0;
            }
            else {
              local_16c = (ushort)*(undefined4 *)&pvStack_c8->field_0x14 & 0x7fff;
            }
            *(ushort *)&pvStack_c8->field_0x12 =
                 *(ushort *)&pvStack_c8->field_0x12 & 0x8000 | local_16c;
          }
        }
      }
      *(uint *)&pvStack_c8->field_0x14 =
           *(uint *)&pvStack_c8->field_0x14 & 0x8001ffff |
           (uint)(*(ushort *)((long)&bi->addr + 8) & 0x3fff) << 0x11;
    }
    local_70._0_4_ = *(undefined4 *)((pi.blocks)->addr).v4._M_elems;
    ::std::vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>::
    push_back((vector<libtorrent::partial_piece_info,_std::allocator<libtorrent::partial_piece_info>_>
               *)q.m_ptr,(value_type *)local_70);
    i._4_4_ = i._4_4_ + 1;
  }
  return;
}

Assistant:

void initialize_piece_info(piece_picker const& p
		, torrent_info const& ti
		, int const block_size
		, std::vector<block_info>& blk
		, span<piece_picker::downloading_piece const> q
		, std::vector<partial_piece_info>* queue)
	{
		const int blocks_per_piece = p.blocks_in_piece(piece_index_t(0));
		int counter = 0;
		for (auto i = q.begin(); i != q.end(); ++i, ++counter)
		{
			partial_piece_info pi;
			pi.blocks_in_piece = p.blocks_in_piece(i->index);
			pi.finished = int(i->finished);
			pi.writing = int(i->writing);
			pi.requested = int(i->requested);
#if TORRENT_ABI_VERSION == 1
			pi.piece_state = partial_piece_info::none;
#endif
			TORRENT_ASSERT(counter * blocks_per_piece + pi.blocks_in_piece <= int(blk.size()));
			block_info* blocks = &blk[std::size_t(counter * blocks_per_piece)];
			pi.blocks = blocks;
			int const piece_size = ti.piece_size(i->index);
			int idx = -1;
			for (auto const& info : p.blocks_for_piece(*i))
			{
				++idx;
				block_info& bi = blocks[idx];
				bi.state = info.state;
				bi.block_size = idx < pi.blocks_in_piece - 1
					? aux::numeric_cast<std::uint32_t>(block_size)
					: aux::numeric_cast<std::uint32_t>(piece_size - (idx * block_size));
				bool const complete = bi.state == block_info::writing
					|| bi.state == block_info::finished;
				if (info.peer == nullptr)
				{
					bi.set_peer(tcp::endpoint());
					bi.bytes_progress = complete ? bi.block_size : 0;
				}
				else
				{
					torrent_peer* tp = info.peer;
					TORRENT_ASSERT(tp->in_use);
					if (tp->connection)
					{
						auto* peer = static_cast<peer_connection*>(tp->connection);
						TORRENT_ASSERT(peer->m_in_use);
						bi.set_peer(peer->remote());
						if (bi.state == block_info::requested)
						{
							auto pbp = peer->downloading_piece_progress();
							if (pbp.piece_index == i->index && pbp.block_index == idx)
							{
								bi.bytes_progress = aux::numeric_cast<std::uint32_t>(pbp.bytes_downloaded);
								TORRENT_ASSERT(bi.bytes_progress <= bi.block_size);
							}
							else
							{
								bi.bytes_progress = 0;
							}
						}
						else
						{
							bi.bytes_progress = complete ? bi.block_size : 0;
						}
					}
					else
					{
						bi.set_peer(tp->ip());
						bi.bytes_progress = complete ? bi.block_size : 0;
					}
				}

				bi.num_peers = info.num_peers;
			}
			pi.piece_index = i->index;
			queue->push_back(pi);
		}
	}